

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundParser.cpp
# Opt level: O2

bool __thiscall
BackgroundParser::ParseBackgroundItem
          (BackgroundParser *this,Parser *parser,ParseNodeFnc *parseNode,bool isDeferred)

{
  ThreadContextId pvVar1;
  code *pcVar2;
  AutoPtr<BackgroundParseItem,_Memory::HeapAllocator> item;
  bool bVar3;
  ThreadContextId pvVar4;
  undefined4 *puVar5;
  BasePtr<BackgroundParseItem> BVar6;
  JobProcessor *this_00;
  AutoPtr<BackgroundParseItem,_Memory::HeapAllocator> local_38;
  AutoPtr<BackgroundParseItem,_Memory::HeapAllocator> workItemAutoPtr;
  
  pvVar1 = this->mainThreadId;
  pvVar4 = JsUtil::ExternalApi::GetCurrentThreadContextId();
  if (pvVar1 != pvVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BackgroundParser.cpp"
                       ,0xa1,"(mainThreadId == GetCurrentThreadContextId())",
                       "Cannot use this member of BackgroundParser from thread other than the creating context\'s current thread"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  BVar6.ptr = NewBackgroundParseItem(this,parser,parseNode,isDeferred);
  local_38.super_BasePtr<BackgroundParseItem>.ptr =
       (BasePtr<BackgroundParseItem>)(BasePtr<BackgroundParseItem>)BVar6.ptr;
  if (BVar6.ptr != (BackgroundParseItem *)0x0) {
    Parser::PrepareForBackgroundParse(parser);
    item.super_BasePtr<BackgroundParseItem>.ptr = local_38.super_BasePtr<BackgroundParseItem>.ptr;
    local_38.super_BasePtr<BackgroundParseItem>.ptr =
         (BasePtr<BackgroundParseItem>)(BackgroundParseItem *)0x0;
    this_00 = JsUtil::JobManager::Processor((JobManager *)this);
    bVar3 = JsUtil::JobProcessor::ProcessesInBackground(this_00);
    AddToParseQueue(this,(BackgroundParseItem *)item.super_BasePtr<BackgroundParseItem>.ptr,false,
                    bVar3);
  }
  AutoPtr<BackgroundParseItem,_Memory::HeapAllocator>::~AutoPtr(&local_38);
  return BVar6.ptr != (BackgroundParseItem *)0x0;
}

Assistant:

bool BackgroundParser::ParseBackgroundItem(Parser *parser, ParseNodeFnc *parseNode, bool isDeferred)
{
    ASSERT_THREAD();

    AutoPtr<BackgroundParseItem> workItemAutoPtr(this->NewBackgroundParseItem(parser, parseNode, isDeferred));
    if ((BackgroundParseItem*) workItemAutoPtr == nullptr)
    {
        // OOM, just skip this work item and return.
        // TODO: Raise an OOM parse-time exception.
        return false;
    }

    parser->PrepareForBackgroundParse();

    BackgroundParseItem * backgroundItem = workItemAutoPtr.Detach();
    this->AddToParseQueue(backgroundItem, false, this->Processor()->ProcessesInBackground());

    return true;
}